

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

void skill_init(def_skill *class_skill)

{
  int iVar1;
  char *local_38;
  bool local_29;
  char *local_28;
  int local_20;
  int skill;
  int skmax;
  obj *obj;
  def_skill *class_skill_local;
  
  for (local_20 = 0; local_20 < 0x2a; local_20 = local_20 + 1) {
    u.weapon_skills[local_20].skill = '\0';
    u.weapon_skills[local_20].max_skill = '\0';
    u.weapon_skills[local_20].advance = 0;
  }
  for (_skill = invent; _skill != (obj *)0x0; _skill = _skill->nobj) {
    iVar1 = weapon_type(_skill);
    if (iVar1 != 0) {
      u.weapon_skills[iVar1].skill = '\x02';
    }
  }
  obj = (obj *)class_skill;
  if ((urole.malenum == 0x15e) || (urole.malenum == 0x160)) {
    u.weapon_skills[0x1f].skill = '\x02';
  }
  else if (urole.malenum == 0x161) {
    u.weapon_skills[0x22].skill = '\x02';
  }
  else if (urole.malenum == 0x168) {
    u.weapon_skills[0x1e].skill = '\x02';
    u.weapon_skills[0x21].skill = '\x02';
  }
  for (; *(char *)&obj->nobj != '\0'; obj = (obj *)((long)&obj->nobj + 2)) {
    iVar1 = (int)*(char *)&obj->nobj;
    u.weapon_skills[iVar1].max_skill = *(xchar *)((long)&obj->nobj + 1);
    if (u.weapon_skills[iVar1].skill == '\0') {
      u.weapon_skills[iVar1].skill = '\x01';
    }
  }
  if ('\x04' < u.weapon_skills[0x25].max_skill) {
    u.weapon_skills[0x25].skill = '\x02';
  }
  if (urole.petnum == 0x6b) {
    u.weapon_skills[0x27].skill = '\x02';
  }
  for (local_20 = 0; local_20 < 0x2a; local_20 = local_20 + 1) {
    if (u.weapon_skills[local_20].skill != '\0') {
      if (u.weapon_skills[local_20].max_skill < u.weapon_skills[local_20].skill) {
        if (skill_names_indices[local_20] < 1) {
          if (local_20 == 0x25) {
            local_29 = urole.malenum == 0x165 || urole.malenum == 0x160;
            local_38 = barehands_or_martial[(int)(uint)local_29];
          }
          else {
            local_38 = odd_skill_names[-(int)skill_names_indices[local_20]];
          }
          local_28 = local_38;
        }
        else {
          local_28 = obj_descr[objects[skill_names_indices[local_20]].oc_name_idx].oc_name;
        }
        impossible("skill_init: curr > max: %s",local_28);
        u.weapon_skills[local_20].max_skill = u.weapon_skills[local_20].skill;
      }
      iVar1 = practice_needed_to_advance(local_20,u.weapon_skills[local_20].skill + -1);
      u.weapon_skills[local_20].advance = (unsigned_short)iVar1;
    }
  }
  return;
}

Assistant:

void skill_init(const struct def_skill *class_skill)
{
	struct obj *obj;
	int skmax, skill;

	/* initialize skill array; by default, everything is restricted */
	for (skill = 0; skill < P_NUM_SKILLS; skill++) {
	    P_SKILL(skill) = P_ISRESTRICTED;
	    P_MAX_SKILL(skill) = P_ISRESTRICTED;
	    P_ADVANCE(skill) = 0;
	}

	/* Set skill for all weapons in inventory to be basic */
	for (obj = invent; obj; obj = obj->nobj) {
	    skill = weapon_type(obj);
	    if (skill != P_NONE)
		P_SKILL(skill) = P_BASIC;
	}

	/* set skills for magic */
	if (Role_if (PM_HEALER) || Role_if(PM_MONK)) {
		P_SKILL(P_HEALING_SPELL) = P_BASIC;
	} else if (Role_if (PM_PRIEST)) {
		P_SKILL(P_CLERIC_SPELL) = P_BASIC;
	} else if (Role_if (PM_WIZARD)) {
		P_SKILL(P_ATTACK_SPELL) = P_BASIC;
		P_SKILL(P_ENCHANTMENT_SPELL) = P_BASIC;
	}

	/* walk through array to set skill maximums */
	for (; class_skill->skill != P_NONE; class_skill++) {
	    skmax = class_skill->skmax;
	    skill = class_skill->skill;

	    P_MAX_SKILL(skill) = skmax;
	    if (P_SKILL(skill) == P_ISRESTRICTED)	/* skill pre-set */
		P_SKILL(skill) = P_UNSKILLED;
	}

	/* High potential fighters already know how to use their hands. */
	if (P_MAX_SKILL(P_BARE_HANDED_COMBAT) > P_EXPERT)
	    P_SKILL(P_BARE_HANDED_COMBAT) = P_BASIC;

	/* Roles that start with a horse know how to ride it */
	if (urole.petnum == PM_PONY)
	    P_SKILL(P_RIDING) = P_BASIC;

	/*
	 * Make sure we haven't missed setting the max on a skill
	 * & set advance
	 */
	for (skill = 0; skill < P_NUM_SKILLS; skill++) {
	    if (!P_RESTRICTED(skill)) {
		if (P_MAX_SKILL(skill) < P_SKILL(skill)) {
		    impossible("skill_init: curr > max: %s", P_NAME(skill));
		    P_MAX_SKILL(skill) = P_SKILL(skill);
		}
		P_ADVANCE(skill) = practice_needed_to_advance(skill, P_SKILL(skill) - 1);
	    }
	}
}